

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.h
# Opt level: O3

ostream * operator<<(ostream *out,Person *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Id : ",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(p->id)._M_dataplus._M_p,(p->id)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Name : ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(p->name)._M_dataplus._M_p,(p->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Address : ",0xb);
  poVar1 = operator<<(poVar1,&p->address);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Person &p) {
        out << "Id : " << p.id << " Name : " << p.name << " Address : " << p.address << std::endl;
        return out;
    }